

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O2

void __thiscall
cmdline::parser::add<std::__cxx11::string>
          (parser *this,string *name,char short_name,string *desc,bool need,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *def)

{
  undefined7 in_register_00000011;
  undefined7 in_register_00000081;
  string local_50 [32];
  
  std::__cxx11::string::string(local_50,(string *)def);
  add<std::__cxx11::string,cmdline::default_reader<std::__cxx11::string>>
            (this,name,CONCAT71(in_register_00000011,short_name) & 0xffffffff,desc,
             CONCAT71(in_register_00000081,need) & 0xffffffff,local_50);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void add(const std::string &name,
           char short_name=0,
           const std::string &desc="",
           bool need=true,
           const T def=T()){
    add(name, short_name, desc, need, def, default_reader<T>());
  }